

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzconnect.cpp
# Opt level: O1

void __thiscall TPZConnect::Write(TPZConnect *this,TPZStream *buf,int withclassid)

{
  (*buf->_vptr_TPZStream[5])(buf,&this->fSequenceNumber,1);
  (*buf->_vptr_TPZStream[3])(buf,&this->fNElConnected,1);
  (*buf->_vptr_TPZStream[4])(buf,&this->field_2,1);
  (*buf->_vptr_TPZStream[10])(buf,&this->field_2,1);
  (*buf->_vptr_TPZStream[10])(buf,(undefined1 *)((long)&this->field_2 + 1),1);
  (*buf->_vptr_TPZStream[10])(buf,(undefined1 *)((long)&this->field_2 + 2),1);
  (*buf->_vptr_TPZStream[2])(buf,(ulong)(this->field_2).fCompose.fIsCondensed);
  (*buf->_vptr_TPZStream[4])(buf,&this->fNShape,1);
  TPZPersistenceManager::WritePointer(&this->fDependList->super_TPZSavable,buf);
  return;
}

Assistant:

void TPZConnect::Write(TPZStream &buf, int withclassid) const { //ok
    buf.Write(&fSequenceNumber);
    buf.Write(&fNElConnected);
    buf.Write(&fFlags);
    buf.Write(&fCompose.fOrder);
    buf.Write(&fCompose.fNState);
    buf.Write(&fCompose.fLagrangeMultiplier);
    buf.Write(fCompose.fIsCondensed);
    buf.Write(&fNShape);
    TPZPersistenceManager::WritePointer(fDependList, &buf);
}